

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

int __thiscall cs_impl::any::holder<int>::kill(holder<int> *this,__pid_t __pid,int __sig)

{
  undefined8 *puVar1;
  int extraout_EAX;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  (**(this->super_baseHolder)._vptr_baseHolder)
            (this,CONCAT44(in_register_00000034,__pid),CONCAT44(in_register_00000014,__sig));
  if ((DAT_0026e2b8 < 0x40) && (cs::global_thread_counter == 0)) {
    puVar1 = &allocator + DAT_0026e2b8;
    DAT_0026e2b8 = DAT_0026e2b8 + 1;
    *puVar1 = this;
    return 0x26e0b0;
  }
  operator_delete(this,0x10);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}